

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O3

ParameterError parse_range(GlobalConfig *global,OperationConfig *config,char *nextarg)

{
  byte bVar1;
  int iVar2;
  ParameterError PVar3;
  char *pcVar4;
  curl_off_t value;
  char buffer [32];
  byte *local_58;
  curl_off_t local_50;
  char local_48 [40];
  
  local_58 = (byte *)nextarg;
  if ((config->field_0x4e4 & 0x10) == 0) {
    iVar2 = Curl_str_number((char **)&local_58,&local_50,0x7fffffffffffffff);
    if ((iVar2 == 0) && (iVar2 = Curl_str_single((char **)&local_58,'-'), iVar2 != 0)) {
      warnf(global,"A specified range MUST include at least one dash (-). Appending one for you");
      curl_msnprintf(local_48,0x20,"%ld-",local_50);
      free(config->range);
      pcVar4 = strdup(local_48);
      config->range = pcVar4;
      PVar3 = PARAM_NO_MEM;
      if (pcVar4 != (char *)0x0) {
        PVar3 = PARAM_OK;
      }
    }
    else {
      bVar1 = *local_58;
      while (bVar1 != 0) {
        if ((bVar1 & 0xfe) != 0x2c && 9 < (byte)(bVar1 - 0x30)) {
          warnf(global,
                "Invalid character is found in given range. A specified range MUST have only digits in \'start\'-\'stop\'. The server\'s response to this request is uncertain."
               );
          break;
        }
        bVar1 = local_58[1];
        local_58 = local_58 + 1;
      }
      PVar3 = getstr(&config->range,nextarg,false);
    }
  }
  else {
    errorf(global,"--continue-at is mutually exclusive with --range");
    PVar3 = PARAM_BAD_USE;
  }
  return PVar3;
}

Assistant:

static ParameterError parse_range(struct GlobalConfig *global,
                                  struct OperationConfig *config,
                                  const char *nextarg)
{
  ParameterError err = PARAM_OK;
  curl_off_t value;
  const char *orig = nextarg;

  if(config->use_resume) {
    errorf(global, "--continue-at is mutually exclusive with --range");
    return PARAM_BAD_USE;
  }
  if(!curlx_str_number(&nextarg, &value, CURL_OFF_T_MAX) &&
     curlx_str_single(&nextarg, '-')) {
    /* Specifying a range WITHOUT A DASH will create an illegal HTTP range
       (and will not actually be range by definition). The manpage previously
       claimed that to be a good way, why this code is added to work-around
       it. */
    char buffer[32];
    warnf(global, "A specified range MUST include at least one dash (-). "
          "Appending one for you");
    msnprintf(buffer, sizeof(buffer), "%" CURL_FORMAT_CURL_OFF_T "-",
              value);
    free(config->range);
    config->range = strdup(buffer);
    if(!config->range)
      err = PARAM_NO_MEM;
  }
  else {
    /* byte range requested */
    while(*nextarg) {
      if(!ISDIGIT(*nextarg) && *nextarg != '-' && *nextarg != ',') {
        warnf(global, "Invalid character is found in given range. "
              "A specified range MUST have only digits in "
              "\'start\'-\'stop\'. The server's response to this "
              "request is uncertain.");
        break;
      }
      nextarg++;
    }
    err = getstr(&config->range, orig, DENY_BLANK);
  }
  return err;
}